

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.c
# Opt level: O1

void armci_stride_info_next(stride_info_t *sinfo)

{
  int iVar1;
  ulong uVar2;
  
  if (sinfo == (stride_info_t *)0x0) {
    __assert_fail("sinfo!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x60,"void armci_stride_info_next(stride_info_t *)");
  }
  if (sinfo->size <= sinfo->pos) {
    __assert_fail("sinfo->pos <sinfo->size",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                  ,0x61,"void armci_stride_info_next(stride_info_t *)");
  }
  sinfo->pos = sinfo->pos + 1;
  iVar1 = sinfo->stride_levels;
  if (0 < iVar1) {
    sinfo->itr[0] = sinfo->itr[0] + 1;
    uVar2 = 0;
    if (iVar1 != 1) {
      uVar2 = 0;
      do {
        if (sinfo->itr[uVar2] != sinfo->seg_count[uVar2 + 1]) goto LAB_001ef4a0;
        sinfo->itr[uVar2] = 0;
        sinfo->itr[uVar2 + 1] = sinfo->itr[uVar2 + 1] + 1;
        uVar2 = uVar2 + 1;
      } while (iVar1 - 1U != uVar2);
      uVar2 = (ulong)(iVar1 - 1U);
    }
LAB_001ef4a0:
    if (sinfo->seg_count[(uVar2 & 0xffffffff) + 1] < sinfo->itr[uVar2 & 0xffffffff]) {
      __assert_fail("sinfo->itr[i] <= sinfo->seg_count[i+1]",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/iterator.c"
                    ,0x69,"void armci_stride_info_next(stride_info_t *)");
    }
  }
  return;
}

Assistant:

void armci_stride_info_next(stride_info_t *sinfo) {
  int i;
  assert(sinfo!=NULL);
  assert(sinfo->pos <sinfo->size);
  sinfo->pos += 1;
  if(sinfo->stride_levels>0) {
    sinfo->itr[0] += 1;
    for(i=0; i<sinfo->stride_levels-1 && sinfo->itr[i]==sinfo->seg_count[i+1]; i++) {
      sinfo->itr[i] = 0;
      sinfo->itr[i+1] += 1;
    }
    assert(sinfo->itr[i] <= sinfo->seg_count[i+1]);
  }
}